

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IFCImporter::InternReadFile
          (IFCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *__rhs;
  size_type *psVar1;
  ObjectMapByType *this_00;
  pointer pcVar2;
  size_type sVar3;
  pointer pLVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  _Alloc_hider _Var12;
  _Head_base<0UL,_Assimp::STEP::DB_*,_false> _Var13;
  aiScene *paVar14;
  pointer __src;
  pointer __src_00;
  undefined4 uVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined4 extraout_var;
  long lVar19;
  long lVar20;
  size_t sVar21;
  uint8_t *puVar22;
  MemoryIOStream *__p;
  long *plVar23;
  const_iterator cVar24;
  IfcUnitAssignment *pIVar25;
  IfcRepresentationContext *pIVar26;
  void *pvVar27;
  Object *pOVar28;
  aiNode *paVar29;
  undefined8 *puVar30;
  _Base_ptr p_Var31;
  IfcObjectDefinition *pIVar32;
  aiNode *paVar33;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var34;
  IFCImporter *pIVar35;
  char *pcVar36;
  aiNode **ppaVar37;
  aiMesh **__s;
  aiMaterial **__s_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  ulong *puVar39;
  _Base_ptr p_Var40;
  LazyObject *this_01;
  pointer pcVar41;
  undefined8 uVar42;
  ulong uVar43;
  char **ppcVar44;
  pointer pLVar45;
  ulong uVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined4 in_XMM2_Db;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined4 in_XMM7_Db;
  float fVar64;
  float fVar65;
  undefined4 in_XMM9_Db;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar73;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  size_type __dnew;
  ConversionSchema schema;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  shared_ptr<Assimp::IOStream> stream;
  char filename [256];
  unz_file_info fileInfo;
  _Head_base<0UL,_Assimp::STEP::DB_*,_false> local_500;
  string local_4f8;
  string local_4d8;
  undefined1 local_4b8 [32];
  _Base_ptr local_498;
  size_t local_490;
  undefined8 local_488;
  undefined8 *local_478;
  long lStack_470;
  long local_468;
  undefined8 local_458;
  undefined8 local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  float local_40c;
  float local_408;
  float local_404;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  float local_3e8;
  float local_3e4;
  float local_3e0;
  float local_3dc;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined8 local_398;
  shared_ptr<Assimp::IOStream> local_388;
  undefined1 local_378 [32];
  IfcProject *local_358;
  aiScene *local_350;
  undefined1 local_348 [64];
  double local_308;
  double dStack_300;
  double local_2f8;
  double local_2f0;
  double dStack_2e8;
  _func_int **local_2e0;
  _Base_bitset<1UL> _Stack_2d8;
  double local_2d0;
  pointer local_2c8;
  pointer ppaStack_2c0;
  pointer local_2b8;
  pointer ppaStack_2b0;
  pointer local_2a8;
  pointer ppaStack_2a0;
  _Rb_tree_node_base local_290;
  size_t local_270;
  _Rb_tree_node_base local_260;
  size_t local_240;
  Settings *local_238;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_230;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_228;
  _Rb_tree_node_base local_218;
  size_t local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [4];
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c0;
  undefined8 uStack_1b0;
  float local_1a8;
  undefined8 local_1a4;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  ios_base local_160 [264];
  float local_58;
  float local_48;
  
  pcVar41 = local_378 + 0x10;
  local_378._0_8_ = pcVar41;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"rb","");
  iVar17 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_378._0_8_);
  local_3c8._M_ptr = (element_type *)CONCAT44(extraout_var,iVar17);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_3c8._M_refcount,local_3c8._M_ptr);
  if ((pointer)local_378._0_8_ != pcVar41) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
  if (local_3c8._M_ptr == (IOStream *)0x0) {
    local_378._0_8_ = pcVar41;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_378,"Could not open file for reading","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
    if ((pointer)local_378._0_8_ != pcVar41) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
  }
  BaseImporter::GetExtension((string *)local_378,pFile);
  iVar17 = std::__cxx11::string::compare(local_378);
  if ((pointer)local_378._0_8_ != pcVar41) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
  local_488 = pScene;
  if (iVar17 == 0) {
    lVar19 = unzOpen((pFile->_M_dataplus)._M_p);
    if (lVar19 == 0) {
      local_378._0_8_ = pcVar41;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,"Could not open ifczip file for reading, unzip failed","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
      if ((pointer)local_378._0_8_ != pcVar41) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
      }
    }
    std::__cxx11::string::substr((ulong)local_4b8,(ulong)pFile);
    lVar20 = std::__cxx11::string::rfind((char)pFile,0x5c);
    if ((lVar20 != -1) || (lVar20 = std::__cxx11::string::rfind((char)pFile,0x2f), lVar20 != -1)) {
      std::__cxx11::string::substr((ulong)local_378,(ulong)local_4b8);
      std::__cxx11::string::operator=((string *)local_4b8,(string *)local_378);
      if ((pointer)local_378._0_8_ != pcVar41) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
      }
    }
    iVar17 = unzGoToFirstFile(lVar19);
    if (iVar17 == 0) {
      local_448 = this;
      do {
        unzGetCurrentFileInfo(lVar19,local_1d0,local_378,0x100,0,0,0,0);
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        sVar21 = strlen(local_378);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4d8,local_378,local_378 + sVar21);
        BaseImporter::GetExtension(&local_4f8,&local_4d8);
        iVar17 = std::__cxx11::string::compare((char *)&local_4f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
      } while (iVar17 != 0);
      puVar22 = (uint8_t *)operator_new__(CONCAT44(fStack_194,fStack_198));
      LogFunctions<Assimp::IFCImporter>::LogInfo((char *)0x4cc025);
      unzOpenCurrentFile(lVar19);
      lVar20 = 0;
      while( true ) {
        uVar46 = CONCAT44(fStack_194,fStack_198);
        if (0x7ffe < uVar46) {
          uVar46 = 0x7fff;
        }
        pvVar27 = malloc(uVar46);
        uVar18 = unzReadCurrentFile(lVar19,pvVar27,uVar46 & 0xffffffff);
        if ((int)uVar18 < 1) break;
        memcpy(puVar22 + lVar20,pvVar27,(ulong)uVar18);
        lVar20 = lVar20 + (ulong)uVar18;
        free(pvVar27);
      }
      free(pvVar27);
      pScene = local_488;
      if ((lVar20 == 0) || (lVar20 != CONCAT44(fStack_194,fStack_198))) {
        operator_delete__(puVar22);
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4f8,"Failed to decompress IFC ZIP file","");
        LogFunctions<Assimp::IFCImporter>::ThrowException(&local_4f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
      }
      unzCloseCurrentFile(lVar19);
      __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_007d9f40;
      __p->buffer = puVar22;
      __p->length = CONCAT44(fStack_194,fStack_198);
      __p->pos = 0;
      __p->own = true;
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                (&local_3c8,__p);
      this = local_448;
    }
    else {
      local_378._0_8_ = pcVar41;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,"Found no IFC file member in IFCZIP file (2)","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
      if ((pointer)local_378._0_8_ != pcVar41) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
      }
    }
    unzClose(lVar19);
    if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
      operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
    }
  }
  pcVar41 = local_378 + 0x10;
  local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_3c8._M_ptr;
  local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3c8._M_refcount._M_pi;
  if (local_3c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3c8._M_refcount._M_pi)->_M_use_count = (local_3c8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3c8._M_refcount._M_pi)->_M_use_count = (local_3c8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_500._M_head_impl = STEP::ReadFileHeader(&local_388);
  if (local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var13._M_head_impl = local_500._M_head_impl;
  __rhs = &((local_500._M_head_impl)->header).fileSchema;
  if (((local_500._M_head_impl)->header).fileSchema._M_string_length == 0) {
LAB_004cc236:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   "Unrecognized file schema: ",__rhs);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
    if ((pointer)local_378._0_8_ != pcVar41) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_378,(ulong)__rhs);
    iVar17 = std::__cxx11::string::compare(local_378);
    if ((pointer)local_378._0_8_ != pcVar41) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
    pScene = local_488;
    if (iVar17 != 0) goto LAB_004cc236;
  }
  bVar16 = DefaultLogger::isNullLogger();
  if (!bVar16) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                   "File schema is \'",__rhs);
    plVar23 = (long *)std::__cxx11::string::_M_replace_aux
                                ((ulong)local_4b8,CONCAT44(local_4b8._12_4_,local_4b8._8_4_),0,
                                 '\x01');
    paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar23 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar23 == paVar38) {
      sVar3 = paVar38->_M_allocated_capacity;
      lVar19 = plVar23[3];
      aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
      aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
      aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
      aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
      aStack_1c0._8_3_ = (undefined3)lVar19;
      aStack_1c0._M_local_buf[0xb] = (char)((ulong)lVar19 >> 0x18);
      aStack_1c0._12_4_ = (undefined4)((ulong)lVar19 >> 0x20);
      _local_1d0 = (pointer)&aStack_1c0;
    }
    else {
      sVar3 = paVar38->_M_allocated_capacity;
      aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
      aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
      aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
      aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
      _local_1d0 = (pointer)*plVar23;
    }
    fStack_1c8 = (float)plVar23[1];
    fStack_1c4 = (float)((ulong)plVar23[1] >> 0x20);
    *plVar23 = (long)paVar38;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_378,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_378);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
    std::ios_base::~ios_base((ios_base *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0,
                      CONCAT17(aStack_1c0._M_local_buf[7],
                               CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1c0._M_local_buf[4],
                                                 aStack_1c0._M_allocated_capacity._0_4_))) + 1);
    }
    pcVar2 = local_4b8 + 0x10;
    if ((pointer)local_4b8._0_8_ != pcVar2) {
      operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
    }
    if (((_Var13._M_head_impl)->header).timestamp._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                     "Timestamp \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var13._M_head_impl);
      plVar23 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_4b8,CONCAT44(local_4b8._12_4_,local_4b8._8_4_),0,
                                   '\x01');
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar23 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar23 == paVar38) {
        sVar3 = paVar38->_M_allocated_capacity;
        lVar19 = plVar23[3];
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        aStack_1c0._8_3_ = (undefined3)lVar19;
        aStack_1c0._M_local_buf[0xb] = (char)((ulong)lVar19 >> 0x18);
        aStack_1c0._12_4_ = (undefined4)((ulong)lVar19 >> 0x20);
        _local_1d0 = (pointer)&aStack_1c0;
      }
      else {
        sVar3 = paVar38->_M_allocated_capacity;
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        _local_1d0 = (pointer)*plVar23;
      }
      fStack_1c8 = (float)plVar23[1];
      fStack_1c4 = (float)((ulong)plVar23[1] >> 0x20);
      *plVar23 = (long)paVar38;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_378);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      std::ios_base::~ios_base((ios_base *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1d0 != &aStack_1c0) {
        operator_delete(_local_1d0,
                        CONCAT17(aStack_1c0._M_local_buf[7],
                                 CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                          CONCAT14(aStack_1c0._M_local_buf[4],
                                                   aStack_1c0._M_allocated_capacity._0_4_))) + 1);
      }
      if ((pointer)local_4b8._0_8_ != pcVar2) {
        operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
      }
    }
    if (((_Var13._M_head_impl)->header).app._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                     "Application/Exporter identline is \'",&((_Var13._M_head_impl)->header).app);
      plVar23 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_4b8,CONCAT44(local_4b8._12_4_,local_4b8._8_4_),0,
                                   '\x01');
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar23 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar23 == paVar38) {
        sVar3 = paVar38->_M_allocated_capacity;
        lVar19 = plVar23[3];
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        aStack_1c0._8_3_ = (undefined3)lVar19;
        aStack_1c0._M_local_buf[0xb] = (char)((ulong)lVar19 >> 0x18);
        aStack_1c0._12_4_ = (undefined4)((ulong)lVar19 >> 0x20);
        _local_1d0 = (pointer)&aStack_1c0;
      }
      else {
        sVar3 = paVar38->_M_allocated_capacity;
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        _local_1d0 = (pointer)*plVar23;
      }
      fStack_1c8 = (float)plVar23[1];
      fStack_1c4 = (float)((ulong)plVar23[1] >> 0x20);
      *plVar23 = (long)paVar38;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_378);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      std::ios_base::~ios_base((ios_base *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1d0 != &aStack_1c0) {
        operator_delete(_local_1d0,
                        CONCAT17(aStack_1c0._M_local_buf[7],
                                 CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                          CONCAT14(aStack_1c0._M_local_buf[4],
                                                   aStack_1c0._M_allocated_capacity._0_4_))) + 1);
      }
      if ((pointer)local_4b8._0_8_ != pcVar2) {
        operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
      }
    }
  }
  local_4b8._24_8_ = local_4b8 + 8;
  local_4b8._8_4_ = _S_red;
  local_4b8._16_8_ = 0;
  local_490 = 0;
  local_498 = (_Base_ptr)local_4b8._24_8_;
  Assimp::IFC::Schema_2x3::GetSchema((ConversionSchema *)local_4b8);
  ppcVar44 = InternReadFile::inverse_indices_to_track;
  STEP::ReadFile(local_500._M_head_impl,(ConversionSchema *)local_4b8,InternReadFile::types_to_track
                 ,3,InternReadFile::inverse_indices_to_track,6);
  _Var13._M_head_impl = local_500._M_head_impl;
  local_378._0_8_ = pcVar41;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"ifcproject","");
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find(&((_Var13._M_head_impl)->objects_bytype)._M_t,(key_type *)local_378);
  if (((_Rb_tree_header *)cVar24._M_node ==
       &((_Var13._M_head_impl)->objects_bytype)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar24._M_node[3]._M_parent == (_Base_ptr)0x0)) {
    this_01 = (LazyObject *)0x0;
  }
  else {
    this_01 = *(LazyObject **)(cVar24._M_node[2]._M_right + 1);
  }
  if ((pointer)local_378._0_8_ != pcVar41) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
  if (this_01 == (LazyObject *)0x0) {
    local_378._0_8_ = pcVar41;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_378,"missing IfcProject entity","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
    if ((pointer)local_378._0_8_ != pcVar41) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
  }
  _Var13._M_head_impl = local_500._M_head_impl;
  local_358 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProject>(this_01);
  local_238 = &this->settings;
  local_290._M_left = &local_290;
  local_378._0_8_ = (pointer)0x3ff0000000000000;
  local_378._8_8_ = -1.0;
  local_378._24_8_ = _Var13._M_head_impl;
  local_348._0_8_ = 1.0;
  local_348._8_8_ = 0.0;
  local_348._16_8_ = 0.0;
  local_348._24_8_ = 0.0;
  local_348._32_8_ = 0.0;
  local_348._40_8_ = 1.0;
  local_348._48_8_ = 0.0;
  local_348._56_8_ = 0.0;
  local_308 = 0.0;
  dStack_300 = 0.0;
  local_2f8 = 1.0;
  local_2f0 = 0.0;
  dStack_2e8 = 0.0;
  local_2e0 = (_func_int **)0x0;
  _Stack_2d8._M_w = 0;
  local_2d0 = 1.0;
  local_290._M_color = _S_red;
  local_290._M_parent = (_Base_ptr)0x0;
  local_2a8 = (pointer)0x0;
  ppaStack_2a0 = (pointer)0x0;
  local_2b8 = (pointer)0x0;
  ppaStack_2b0 = (pointer)0x0;
  local_2c8 = (pointer)0x0;
  ppaStack_2c0 = (pointer)0x0;
  local_270 = 0;
  local_260._M_left = &local_260;
  local_260._M_color = _S_red;
  local_260._M_parent = (_Base_ptr)0x0;
  local_240 = 0;
  local_218._M_left = &local_218;
  local_218._M_color = _S_red;
  local_218._M_parent = (_Base_ptr)0x0;
  local_230 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  pvStack_228 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  local_1f8 = 0;
  local_350 = pScene;
  local_290._M_right = local_290._M_left;
  local_260._M_right = local_260._M_left;
  local_218._M_right = local_218._M_left;
  pIVar25 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                      ((local_358->UnitsInContext).obj);
  if (*(long *)&(pIVar25->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x18 !=
      *(long *)&(pIVar25->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x10) {
    lVar19 = 0;
    uVar46 = 0;
    do {
      pIVar25 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          ((local_358->UnitsInContext).obj);
      anon_unknown.dwarf_d8f3db::ConvertUnit
                (*(DataType **)
                  (*(long *)&(pIVar25->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                             field_0x10 + lVar19),(ConversionData *)local_378);
      pIVar25 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          ((local_358->UnitsInContext).obj);
      uVar46 = uVar46 + 1;
      lVar19 = lVar19 + 0x10;
    } while (uVar46 < (ulong)(*(long *)&(pIVar25->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x18 -
                              *(long *)&(pIVar25->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x10 >> 4));
  }
  pLVar45 = (local_358->RepresentationContexts).
            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            .
            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (local_358->RepresentationContexts).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar45 != pLVar4) {
    do {
      pIVar26 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationContext>
                          (pLVar45->obj);
      if ((pIVar26->ContextType).have == true) {
        iVar17 = std::__cxx11::string::compare((char *)&pIVar26->ContextType);
        if (iVar17 == 0) break;
      }
      pLVar45 = pLVar45 + 1;
    } while (pLVar45 != pLVar4);
    lVar19 = __dynamic_cast((_func_int *)
                            ((long)&(pIVar26->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                    )._vptr_ObjectHelper +
                            (long)(pIVar26->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                            &Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::typeinfo,
                            0xffffffffffffffff);
    if (lVar19 != 0) {
      Assimp::IFC::ConvertAxisPlacement
                ((IfcMatrix4 *)local_348,*(IfcAxis2Placement **)(lVar19 + 0x88),
                 (ConversionData *)local_378);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4cc87d);
    }
  }
  uVar42 = local_378._24_8_;
  this_00 = (ObjectMapByType *)(local_378._24_8_ + 0x90);
  aStack_1c0._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1c0._M_local_buf[4] = 'i';
  aStack_1c0._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c8 = 9.80909e-45;
  fStack_1c4 = 0.0;
  aStack_1c0._7_4_ = aStack_1c0._7_4_ & 0xffffff00;
  _local_1d0 = (pointer)&aStack_1c0;
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1d0);
  if (cVar24._M_node == (_Base_ptr)(uVar42 + 0x98)) {
    __assert_fail("map.find(\"ifcsite\") != map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                  ,0x374,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1d0 != &aStack_1c0) {
    operator_delete(_local_1d0,
                    CONCAT17(aStack_1c0._M_local_buf[7],
                             CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                      CONCAT14(aStack_1c0._M_local_buf[4],
                                               aStack_1c0._M_allocated_capacity._0_4_))) + 1);
  }
  aStack_1c0._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1c0._M_local_buf[4] = 'i';
  aStack_1c0._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c8 = 9.80909e-45;
  fStack_1c4 = 0.0;
  aStack_1c0._7_4_ = aStack_1c0._7_4_ & 0xffffff00;
  _local_1d0 = (pointer)&aStack_1c0;
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1d0 != &aStack_1c0) {
    operator_delete(_local_1d0,
                    CONCAT17(aStack_1c0._M_local_buf[7],
                             CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                      CONCAT14(aStack_1c0._M_local_buf[4],
                                               aStack_1c0._M_allocated_capacity._0_4_))) + 1);
  }
  if (cVar24._M_node[3]._M_parent == (_Base_ptr)0x0) {
    aStack_1c0._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1c0._M_local_buf[4] = 'u';
    aStack_1c0._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1c0._7_4_ = 0x676e6964;
    fStack_1c8 = 1.54143e-44;
    fStack_1c4 = 0.0;
    aStack_1c0._M_local_buf[0xb] = '\0';
    _local_1d0 = (pointer)&aStack_1c0;
    cVar24 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1d0);
    if (cVar24._M_node == (_Base_ptr)(uVar42 + 0x98)) {
      __assert_fail("map.find(\"ifcbuilding\") != map.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x378,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)")
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0,
                      CONCAT17(aStack_1c0._M_local_buf[7],
                               CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1c0._M_local_buf[4],
                                                 aStack_1c0._M_allocated_capacity._0_4_))) + 1);
    }
    aStack_1c0._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1c0._M_local_buf[4] = 'u';
    aStack_1c0._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1c0._7_4_ = 0x676e6964;
    fStack_1c8 = 1.54143e-44;
    fStack_1c4 = 0.0;
    aStack_1c0._M_local_buf[0xb] = '\0';
    _local_1d0 = (pointer)&aStack_1c0;
    cVar24 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0,
                      CONCAT17(aStack_1c0._M_local_buf[7],
                               CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1c0._M_local_buf[4],
                                                 aStack_1c0._M_allocated_capacity._0_4_))) + 1);
    }
    if (cVar24._M_node[3]._M_parent == (_Base_ptr)0x0) {
      local_4f8._M_dataplus._M_p = (pointer)0x42;
      _local_1d0 = (pointer)&aStack_1c0;
      pvVar27 = (void *)std::__cxx11::string::_M_create((ulong *)local_1d0,(ulong)&local_4f8);
      _Var12._M_p = local_4f8._M_dataplus._M_p;
      local_1d0 = SUB84(pvVar27,0);
      fStack_1cc = (float)((ulong)pvVar27 >> 0x20);
      aStack_1c0._M_allocated_capacity._0_4_ = SUB84(local_4f8._M_dataplus._M_p,0);
      uVar15 = aStack_1c0._M_allocated_capacity._0_4_;
      aStack_1c0._M_local_buf[4] = (char)((ulong)local_4f8._M_dataplus._M_p >> 0x20);
      aStack_1c0._M_allocated_capacity._5_2_ =
           (undefined2)((ulong)local_4f8._M_dataplus._M_p >> 0x28);
      aStack_1c0._M_local_buf[7] = (char)((ulong)local_4f8._M_dataplus._M_p >> 0x38);
      memcpy(pvVar27,"no root element found (expected IfcBuilding or preferably IfcSite)",0x42);
      fStack_1c4 = (float)((ulong)_Var12._M_p >> 0x20);
      *(char *)((long)pvVar27 + (long)_Var12._M_p) = '\0';
      fStack_1c8 = (float)uVar15;
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1d0 != &aStack_1c0) {
        operator_delete(_local_1d0,
                        CONCAT17(aStack_1c0._M_local_buf[7],
                                 CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                          CONCAT14(aStack_1c0._M_local_buf[4],
                                                   aStack_1c0._M_allocated_capacity._0_4_))) + 1);
      }
    }
  }
  local_478 = (undefined8 *)0x0;
  lStack_470 = 0;
  local_468 = 0;
  pIVar35 = (IFCImporter *)cVar24._M_node[2]._M_right;
  local_458 = (IFCImporter *)&cVar24._M_node[2]._M_parent;
  if (pIVar35 != local_458) {
    local_398 = cVar24._M_node;
    do {
      local_448 = pIVar35;
      pOVar28 = STEP::LazyObject::operator*
                          ((LazyObject *)
                           (pIVar35->super_BaseImporter).importerUnits._M_t._M_impl.
                           super__Rb_tree_header._M_header._M_left);
      paVar29 = (aiNode *)
                __dynamic_cast(pOVar28,&STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo,
                               0xffffffffffffffff);
      _Var12._M_p = _local_1d0;
      if (paVar29 != (aiNode *)0x0) {
        if ((paVar29->mName).data[0x54] == '\x01') {
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          lVar19 = *(long *)((paVar29->mName).data + 0x34);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,lVar19,*(long *)((paVar29->mName).data + 0x3c) + lVar19);
        }
        else {
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          local_3b8.field_2._M_allocated_capacity._0_4_ = 0x616e6e75;
          local_3b8._M_string_length = 7;
          local_3b8.field_2._M_allocated_capacity._4_4_ = 0x64656d;
        }
        std::operator+(&local_1f0,"looking at spatial structure `",&local_3b8);
        paVar38 = &local_4d8.field_2;
        plVar23 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        puVar39 = (ulong *)(plVar23 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar39) {
          local_4d8.field_2._M_allocated_capacity = *puVar39;
          local_4d8.field_2._8_8_ = plVar23[3];
          local_4d8._M_dataplus._M_p = (pointer)paVar38;
        }
        else {
          local_4d8.field_2._M_allocated_capacity = *puVar39;
          local_4d8._M_dataplus._M_p = (pointer)*plVar23;
        }
        local_4d8._M_string_length = plVar23[1];
        *plVar23 = (long)puVar39;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        if ((paVar29->mName).data[0xc4] == '\x01') {
          std::operator+(&local_430," which is of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((paVar29->mName).data + 0xa4));
        }
        else {
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          local_430._M_string_length = 0;
          local_430.field_2._M_local_buf[0] = '\0';
        }
        uVar42 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != paVar38) {
          uVar42 = local_4d8.field_2._M_allocated_capacity;
        }
        uVar46 = (long)&(((_Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           *)local_4d8._M_string_length)->_M_impl).super__Vector_impl_data._M_start
                 + local_430._M_string_length;
        ppcVar44 = (char **)local_4d8._M_string_length;
        if ((ulong)uVar42 < uVar46) {
          uVar43 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            uVar43 = CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                              local_430.field_2._M_local_buf[0]);
          }
          if (uVar43 < uVar46) goto LAB_004ccc73;
          puVar30 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_430,0,(char *)0x0,(ulong)local_4d8._M_dataplus._M_p);
        }
        else {
LAB_004ccc73:
          puVar30 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_4d8,(ulong)local_430._M_dataplus._M_p);
        }
        psVar1 = puVar30 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar30 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_4f8.field_2._M_allocated_capacity = *psVar1;
          local_4f8.field_2._8_8_ = puVar30[3];
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        }
        else {
          local_4f8.field_2._M_allocated_capacity = *psVar1;
          local_4f8._M_dataplus._M_p = (pointer)*puVar30;
        }
        local_4f8._M_string_length = puVar30[1];
        *puVar30 = psVar1;
        puVar30[1] = 0;
        *(undefined1 *)psVar1 = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1d0,
                   &local_4f8);
        LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,
                          CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                                   local_430.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != paVar38) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,
                          CONCAT44(local_3b8.field_2._M_allocated_capacity._4_4_,
                                   local_3b8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        uVar42 = *(undefined8 *)
                  (&(local_358->super_IfcObject).field_0x8 +
                  *(long *)(*(long *)&local_358->super_IfcObject + -0x18));
        local_1d0 = SUB84(uVar42,0);
        fStack_1cc = (float)((ulong)uVar42 >> 0x20);
        pVar73 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)(local_378._24_8_ + 0xc0),(key_type_conflict *)local_1d0);
        _Var12._M_p = (pointer)CONCAT44(fStack_1cc,local_1d0);
        _Var34 = pVar73.first._M_node;
        while (_Var34._M_node != pVar73.second._M_node._M_node) {
          p_Var40 = (((DB *)local_378._24_8_)->objects)._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_parent;
          p_Var31 = &(((DB *)local_378._24_8_)->objects)._M_t._M_impl.super__Rb_tree_header.
                     _M_header;
          do {
            bVar16 = *(_Base_ptr *)(p_Var40 + 1) < _Var34._M_node[1]._M_parent;
            if (!bVar16) {
              p_Var31 = p_Var40;
            }
            p_Var40 = (&p_Var40->_M_left)[bVar16];
          } while (p_Var40 != (_Base_ptr)0x0);
          pOVar28 = STEP::LazyObject::operator*((LazyObject *)p_Var31[1]._M_parent);
          lVar19 = __dynamic_cast(pOVar28,&STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if (lVar19 != 0) {
            puVar5 = *(undefined8 **)(lVar19 + 0xb8);
            for (puVar30 = *(undefined8 **)(lVar19 + 0xb0); puVar30 != puVar5; puVar30 = puVar30 + 1
                ) {
              pIVar32 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar30);
              if (*(long *)((long)&(pIVar32->super_IfcRoot).
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                   aux_is_derived.super__Base_bitset<1UL>._M_w +
                           (long)(pIVar32->super_IfcRoot).
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                 _vptr_ObjectHelper[-3]) ==
                  *(long *)((paVar29->mName).data + *(long *)(*(long *)&paVar29->mName + -0x18) + 4)
                 ) {
                LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4cce7e);
                paVar33 = anon_unknown.dwarf_d8f3db::ProcessSpatialStructure
                                    ((anon_unknown_dwarf_d8f3db *)0x0,paVar29,
                                     (IfcProduct *)local_378,(ConversionData *)0x0,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)ppcVar44);
                local_1d0 = SUB84(paVar33,0);
                fStack_1cc = (float)((ulong)paVar33 >> 0x20);
                std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)&local_478,
                           (aiNode **)local_1d0);
              }
            }
          }
          _Var34._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var34._M_node);
          _Var12._M_p = (pointer)CONCAT44(fStack_1cc,local_1d0);
        }
      }
      _local_1d0 = _Var12._M_p;
      pIVar35 = (IFCImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_448);
    } while (pIVar35 != local_458);
    lVar19 = lStack_470 - (long)local_478;
    cVar24._M_node = local_398;
    if (lVar19 != 0) goto LAB_004ccfd1;
  }
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4ccf1c);
  pIVar35 = (IFCImporter *)cVar24._M_node[2]._M_right;
  if (pIVar35 != local_458) {
    do {
      pOVar28 = STEP::LazyObject::operator*
                          ((LazyObject *)
                           (pIVar35->super_BaseImporter).importerUnits._M_t._M_impl.
                           super__Rb_tree_header._M_header._M_left);
      paVar29 = (aiNode *)
                __dynamic_cast(pOVar28,&STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo);
      if (paVar29 != (aiNode *)0x0) {
        paVar29 = anon_unknown.dwarf_d8f3db::ProcessSpatialStructure
                            ((anon_unknown_dwarf_d8f3db *)0x0,paVar29,(IfcProduct *)local_378,
                             (ConversionData *)0x0,
                             (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                              *)ppcVar44);
        local_1d0 = SUB84(paVar29,0);
        fStack_1cc = (float)((ulong)paVar29 >> 0x20);
        std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                  ((vector<aiNode*,std::allocator<aiNode*>> *)&local_478,(aiNode **)local_1d0);
      }
      pIVar35 = (IFCImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar35);
    } while (pIVar35 != local_458);
  }
  lVar19 = lStack_470 - (long)local_478;
LAB_004ccfd1:
  paVar14 = local_488;
  lVar20 = lVar19 >> 3;
  if (lVar20 == 0) {
    local_4f8._M_dataplus._M_p = &DAT_00000028;
    _local_1d0 = (pointer)&aStack_1c0;
    pcVar36 = (char *)std::__cxx11::string::_M_create((ulong *)local_1d0,(ulong)&local_4f8);
    local_1d0 = SUB84(pcVar36,0);
    fStack_1cc = (float)((ulong)pcVar36 >> 0x20);
    aStack_1c0._M_allocated_capacity._0_4_ = SUB84(local_4f8._M_dataplus._M_p,0);
    aStack_1c0._M_local_buf[4] = (char)((ulong)local_4f8._M_dataplus._M_p >> 0x20);
    aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_4f8._M_dataplus._M_p >> 0x28)
    ;
    aStack_1c0._M_local_buf[7] = (char)((ulong)local_4f8._M_dataplus._M_p >> 0x38);
    builtin_strncpy(pcVar36,"failed to determine primary site element",0x28);
    fStack_1c4 = (float)((ulong)local_4f8._M_dataplus._M_p >> 0x20);
    pcVar36[(long)local_4f8._M_dataplus._M_p] = '\0';
    fStack_1c8 = (float)aStack_1c0._M_allocated_capacity._0_4_;
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0,
                      CONCAT17(aStack_1c0._M_local_buf[7],
                               CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1c0._M_local_buf[4],
                                                 aStack_1c0._M_allocated_capacity._0_4_))) + 1);
    }
  }
  else if (lVar20 == 1) {
    local_350->mRootNode = (aiNode *)*local_478;
  }
  else {
    paVar29 = (aiNode *)operator_new(0x478);
    aStack_1c0._M_allocated_capacity._0_4_ = 0x746f6f52;
    fStack_1c8 = 5.60519e-45;
    fStack_1c4 = 0.0;
    aStack_1c0._M_local_buf[4] = '\0';
    _local_1d0 = (pointer)&aStack_1c0;
    aiNode::aiNode(paVar29,(string *)local_1d0);
    local_350->mRootNode = paVar29;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0,
                      CONCAT17(aStack_1c0._M_local_buf[7],
                               CONCAT25(aStack_1c0._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1c0._M_local_buf[4],
                                                 aStack_1c0._M_allocated_capacity._0_4_))) + 1);
    }
    local_350->mRootNode->mParent = (aiNode *)0x0;
    local_350->mRootNode->mNumChildren = (uint)lVar20;
    paVar29 = local_350->mRootNode;
    ppaVar37 = (aiNode **)operator_new__((ulong)paVar29->mNumChildren << 3);
    paVar29->mChildren = ppaVar37;
    if (lVar19 != 0) {
      lVar19 = 0;
      do {
        paVar29 = (aiNode *)local_478[lVar19];
        paVar33 = local_350->mRootNode;
        paVar29->mParent = paVar33;
        paVar33->mChildren[lVar19] = paVar29;
        lVar19 = lVar19 + 1;
      } while (lVar20 + (ulong)(lVar20 == 0) != lVar19);
    }
  }
  if (local_478 != (undefined8 *)0x0) {
    operator_delete(local_478,local_468 - (long)local_478);
  }
  local_1d0 = (undefined1  [4])0x3f800000;
  fStack_1cc = 0.0;
  fStack_1c8 = 0.0;
  fStack_1c4 = 0.0;
  aStack_1c0._M_allocated_capacity._0_4_ = 0;
  aStack_1c0._M_local_buf[4] = '\0';
  aStack_1c0._M_allocated_capacity._5_2_ = 0x8000;
  aStack_1c0._7_4_ = 0x3f;
  aStack_1c0._M_local_buf[0xb] = '\0';
  aStack_1c0._12_4_ = 0;
  uStack_1b0 = 0;
  local_1a8 = 1.0;
  local_1a4 = 0;
  fStack_19c = 0.0;
  fStack_198 = 0.0;
  fStack_194 = 1.0;
  anon_unknown.dwarf_d8f3db::MakeTreeRelative(local_350->mRootNode,(aiMatrix4x4 *)local_1d0);
  __src = local_2c8;
  uVar46 = (long)ppaStack_2c0 - (long)local_2c8;
  if (uVar46 != 0) {
    paVar14->mNumMeshes = (uint)(uVar46 >> 3);
    __s = (aiMesh **)operator_new__(uVar46 & 0x7fffffff8);
    memset(__s,0,uVar46 & 0x7fffffff8);
    paVar14->mMeshes = __s;
    memmove(__s,__src,uVar46);
    ppaStack_2c0 = __src;
  }
  __src_00 = ppaStack_2b0;
  uVar46 = (long)local_2a8 - (long)ppaStack_2b0;
  if (uVar46 != 0) {
    paVar14->mNumMaterials = (uint)(uVar46 >> 3);
    __s_00 = (aiMaterial **)operator_new__(uVar46 & 0x7fffffff8);
    memset(__s_00,0,uVar46 & 0x7fffffff8);
    paVar14->mMaterials = __s_00;
    memmove(__s_00,__src_00,uVar46);
    local_2a8 = __src_00;
  }
  fVar57 = (float)(double)local_378._0_8_;
  local_3cc = 0.0 - fVar57;
  fVar62 = (float)(double)local_348._0_8_;
  fVar55 = (float)(double)local_348._8_8_;
  local_400 = (float)(double)local_348._32_8_;
  fVar68 = fVar57 + 0.0;
  local_3d8 = (float)(double)local_348._40_8_;
  fVar52 = (float)local_308;
  local_3fc = fVar57 * 0.0 + 0.0;
  local_48 = (float)dStack_300;
  fVar58 = fVar57 * -4.371139e-08 + 0.0;
  local_3e4 = fVar62 * local_3fc;
  local_3dc = fVar55 * local_3fc;
  fVar66 = (float)(double)local_348._16_8_;
  local_3d0 = (float)(double)local_348._48_8_;
  local_3d4 = fVar66 * local_3fc;
  fVar72 = (float)local_2f8;
  fVar64 = local_3fc + 0.0;
  local_3f8 = fVar52 * fVar64;
  local_3f0 = local_48 * fVar64;
  local_3ec = fVar72 * fVar64;
  local_404 = (float)local_2f0;
  local_3e0 = local_404 * fVar64;
  fVar57 = (float)(double)local_348._24_8_;
  local_408 = local_3fc * fVar57;
  local_58 = fVar55 * fVar64;
  local_40c = (float)(double)local_348._56_8_;
  fVar70 = fVar58 + 0.0;
  fVar53 = fVar62 * fVar64 + local_3fc * local_400 + local_3f8 + (float)dStack_2e8;
  local_458 = (IFCImporter *)CONCAT44(in_XMM7_Db,fVar53);
  fVar59 = (float)dStack_2e8 * 0.0;
  fVar54 = fVar62 * fVar68 + local_3fc * local_400 + local_3f8 + fVar59;
  fVar47 = fVar52 * fVar68 + fVar58 * local_400 + local_3e4 + fVar59;
  local_488 = (aiScene *)CONCAT44(in_XMM2_Db,fVar47);
  fVar59 = fVar52 * fVar70 + local_400 * local_3cc + local_3e4 + fVar59;
  local_398 = (_Base_ptr)CONCAT44(in_XMM2_Db,fVar59);
  fVar48 = local_58 + local_3fc * local_3d8 + local_3f0 + (float)(double)local_2e0;
  fVar60 = (float)(double)local_2e0 * 0.0;
  fVar63 = fVar55 * fVar68 + local_3fc * local_3d8 + local_3f0 + fVar60;
  fVar49 = local_48 * fVar68 + fVar58 * local_3d8 + local_3dc + fVar60;
  local_448 = (IFCImporter *)CONCAT44(in_XMM9_Db,fVar49);
  fVar60 = local_48 * fVar70 + local_3d8 * local_3cc + local_3dc + fVar60;
  fVar67 = fVar66 * fVar64 + local_3fc * local_3d0 + local_3ec + (float)(double)_Stack_2d8._M_w;
  fVar61 = (float)(double)_Stack_2d8._M_w * 0.0;
  fVar56 = fVar66 * fVar68 + local_3fc * local_3d0 + local_3ec + fVar61;
  fVar71 = fVar72 * fVar68 + fVar58 * local_3d0 + local_3d4 + fVar61;
  fVar61 = fVar72 * fVar70 + local_3d0 * local_3cc + local_3d4 + fVar61;
  fVar50 = (float)local_2d0 * 0.0;
  fVar51 = fVar57 * fVar68 + local_3fc * local_40c + local_3e0 + fVar50;
  fVar69 = fVar68 * local_404 + fVar58 * local_40c + local_408 + fVar50;
  fVar50 = fVar70 * local_404 + local_3cc * local_40c + local_408 + fVar50;
  fVar65 = fVar64 * fVar57 + local_3fc * local_40c + local_3e0 + (float)local_2d0;
  paVar29 = paVar14->mRootNode;
  fVar57 = (paVar29->mTransformation).b1;
  fVar52 = (paVar29->mTransformation).b2;
  fVar55 = (paVar29->mTransformation).b3;
  fVar58 = (paVar29->mTransformation).b4;
  fVar62 = (paVar29->mTransformation).a1;
  fVar64 = (paVar29->mTransformation).a2;
  fVar66 = (paVar29->mTransformation).a3;
  fVar68 = (paVar29->mTransformation).a4;
  fVar70 = (paVar29->mTransformation).c1;
  fVar72 = (paVar29->mTransformation).c2;
  fVar6 = (paVar29->mTransformation).c3;
  fVar7 = (paVar29->mTransformation).c4;
  fVar8 = (paVar29->mTransformation).d1;
  fVar9 = (paVar29->mTransformation).d2;
  fVar10 = (paVar29->mTransformation).d3;
  fVar11 = (paVar29->mTransformation).d4;
  (paVar29->mTransformation).a1 =
       fVar51 * fVar8 + fVar56 * fVar70 + fVar54 * fVar62 + fVar63 * fVar57;
  (paVar29->mTransformation).a2 =
       fVar51 * fVar9 + fVar56 * fVar72 + fVar54 * fVar64 + fVar63 * fVar52;
  (paVar29->mTransformation).a3 =
       fVar51 * fVar10 + fVar56 * fVar6 + fVar54 * fVar66 + fVar63 * fVar55;
  (paVar29->mTransformation).a4 =
       fVar51 * fVar11 + fVar56 * fVar7 + fVar54 * fVar68 + fVar63 * fVar58;
  (paVar29->mTransformation).b1 =
       fVar69 * fVar8 + fVar71 * fVar70 + fVar47 * fVar62 + fVar49 * fVar57;
  (paVar29->mTransformation).b2 =
       fVar69 * fVar9 + fVar71 * fVar72 + fVar47 * fVar64 + fVar49 * fVar52;
  (paVar29->mTransformation).b3 =
       fVar69 * fVar10 + fVar71 * fVar6 + fVar47 * fVar66 + fVar49 * fVar55;
  (paVar29->mTransformation).b4 =
       fVar69 * fVar11 + fVar71 * fVar7 + fVar47 * fVar68 + fVar49 * fVar58;
  (paVar29->mTransformation).c1 =
       fVar50 * fVar8 + fVar61 * fVar70 + fVar59 * fVar62 + fVar60 * fVar57;
  (paVar29->mTransformation).c2 =
       fVar50 * fVar9 + fVar61 * fVar72 + fVar59 * fVar64 + fVar60 * fVar52;
  (paVar29->mTransformation).c3 =
       fVar50 * fVar10 + fVar61 * fVar6 + fVar59 * fVar66 + fVar60 * fVar55;
  (paVar29->mTransformation).c4 =
       fVar50 * fVar11 + fVar61 * fVar7 + fVar59 * fVar68 + fVar60 * fVar58;
  (paVar29->mTransformation).d1 =
       fVar65 * fVar8 + fVar67 * fVar70 + fVar53 * fVar62 + fVar48 * fVar57;
  (paVar29->mTransformation).d2 =
       fVar65 * fVar9 + fVar67 * fVar72 + fVar53 * fVar64 + fVar48 * fVar52;
  (paVar29->mTransformation).d3 =
       fVar65 * fVar10 + fVar67 * fVar6 + fVar53 * fVar66 + fVar48 * fVar55;
  (paVar29->mTransformation).d4 =
       fVar65 * fVar11 + fVar67 * fVar7 + fVar53 * fVar68 + fVar48 * fVar58;
  local_3f4 = local_3fc;
  local_3e8 = local_3fc;
  bVar16 = DefaultLogger::isNullLogger();
  if (!bVar16) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"STEP: evaluated ",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0," object records",0xf);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
  }
  Assimp::IFC::ConversionData::~ConversionData((ConversionData *)local_378);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
               *)local_4b8);
  std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr
            ((unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> *)&local_500);
  if (local_3c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_refcount._M_pi);
  }
  return;
}

Assistant:

void IFCImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }


    // if this is a ifczip file, decompress its contents first
    if(GetExtension(pFile) == "ifczip") {
#ifndef ASSIMP_BUILD_NO_COMPRESSED_IFC
        unzFile zip = unzOpen( pFile.c_str() );
        if(zip == NULL) {
            ThrowException("Could not open ifczip file for reading, unzip failed");
        }

        // chop 'zip' postfix
        std::string fileName = pFile.substr(0,pFile.length() - 3);

        std::string::size_type s = pFile.find_last_of('\\');
        if(s == std::string::npos) {
            s = pFile.find_last_of('/');
        }
        if(s != std::string::npos) {
            fileName = fileName.substr(s+1);
        }

        // search file (same name as the IFCZIP except for the file extension) and place file pointer there
        if(UNZ_OK == unzGoToFirstFile(zip)) {
            do {
                // get file size, etc.
                unz_file_info fileInfo;
                char filename[256];
                unzGetCurrentFileInfo( zip , &fileInfo, filename, sizeof(filename), 0, 0, 0, 0 );
                if (GetExtension(filename) != "ifc") {
                    continue;
                }
                uint8_t* buff = new uint8_t[fileInfo.uncompressed_size];
                LogInfo("Decompressing IFCZIP file");
                unzOpenCurrentFile(zip);
                size_t total = 0;
                int read = 0;
                do {
                    int bufferSize = fileInfo.uncompressed_size < INT16_MAX ? fileInfo.uncompressed_size : INT16_MAX;
                    void* buffer = malloc(bufferSize);
                    read = unzReadCurrentFile(zip, buffer, bufferSize);
                    if (read > 0) {
                        memcpy((char*)buff + total, buffer, read);
                        total += read;
                    }
                    free(buffer);
                } while (read > 0);
                size_t filesize = fileInfo.uncompressed_size;
                if (total == 0 || size_t(total) != filesize)
                {
                    delete[] buff;
                    ThrowException("Failed to decompress IFC ZIP file");
                }
                unzCloseCurrentFile( zip );
                stream.reset(new MemoryIOStream(buff,fileInfo.uncompressed_size,true));
                break;

                if (unzGoToNextFile(zip) == UNZ_END_OF_LIST_OF_FILE) {
                    ThrowException("Found no IFC file member in IFCZIP file (1)");
                }

            } while(true);
        }
        else {
            ThrowException("Found no IFC file member in IFCZIP file (2)");
        }

        unzClose(zip);
#else
        ThrowException("Could not open ifczip file for reading, assimp was built without ifczip support");
#endif
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(stream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();

    if(!head.fileSchema.size() || head.fileSchema.substr(0,3) != "IFC") {
        ThrowException("Unrecognized file schema: " + head.fileSchema);
    }

    if (!DefaultLogger::isNullLogger()) {
        LogDebug("File schema is \'" + head.fileSchema + '\'');
        if (head.timestamp.length()) {
            LogDebug("Timestamp \'" + head.timestamp + '\'');
        }
        if (head.app.length()) {
            LogDebug("Application/Exporter identline is \'" + head.app  + '\'');
        }
    }

    // obtain a copy of the machine-generated IFC scheme
    ::Assimp::STEP::EXPRESS::ConversionSchema schema;
    Schema_2x3::GetSchema(schema);

    // tell the reader which entity types to track with special care
    static const char* const types_to_track[] = {
        "ifcsite", "ifcbuilding", "ifcproject"
    };

    // tell the reader for which types we need to simulate STEPs reverse indices
    static const char* const inverse_indices_to_track[] = {
        "ifcrelcontainedinspatialstructure", "ifcrelaggregates", "ifcrelvoidselement", "ifcreldefinesbyproperties", "ifcpropertyset", "ifcstyleditem"
    };

    // feed the IFC schema into the reader and pre-parse all lines
    STEP::ReadFile(*db, schema, types_to_track, inverse_indices_to_track);
    const STEP::LazyObject* proj =  db->GetObject("ifcproject");
    if (!proj) {
        ThrowException("missing IfcProject entity");
    }

    ConversionData conv(*db,proj->To<Schema_2x3::IfcProject>(),pScene,settings);
    SetUnits(conv);
    SetCoordinateSpace(conv);
    ProcessSpatialStructures(conv);
    MakeTreeRelative(conv);

    // NOTE - this is a stress test for the importer, but it works only
    // in a build with no entities disabled. See
    //     scripts/IFCImporter/CPPGenerator.py
    // for more information.
    #ifdef ASSIMP_IFC_TEST
        db->EvaluateAll();
    #endif

    // do final data copying
    if (conv.meshes.size()) {
        pScene->mNumMeshes = static_cast<unsigned int>(conv.meshes.size());
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
        std::copy(conv.meshes.begin(),conv.meshes.end(),pScene->mMeshes);

        // needed to keep the d'tor from burning us
        conv.meshes.clear();
    }

    if (conv.materials.size()) {
        pScene->mNumMaterials = static_cast<unsigned int>(conv.materials.size());
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials]();
        std::copy(conv.materials.begin(),conv.materials.end(),pScene->mMaterials);

        // needed to keep the d'tor from burning us
        conv.materials.clear();
    }

    // apply world coordinate system (which includes the scaling to convert to meters and a -90 degrees rotation around x)
    aiMatrix4x4 scale, rot;
    aiMatrix4x4::Scaling(static_cast<aiVector3D>(IfcVector3(conv.len_scale)),scale);
    aiMatrix4x4::RotationX(-AI_MATH_HALF_PI_F,rot);

    pScene->mRootNode->mTransformation = rot * scale * conv.wcs * pScene->mRootNode->mTransformation;

    // this must be last because objects are evaluated lazily as we process them
    if ( !DefaultLogger::isNullLogger() ){
        LogDebug((Formatter::format(),"STEP: evaluated ",db->GetEvaluatedObjectCount()," object records"));
    }
}